

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_set_dscp.c
# Opt level: O0

int os_fd_generic_set_dscp(os_fd *sock,int dscp,_Bool ipv6)

{
  int iVar1;
  int local_1c;
  _Bool ipv6_local;
  os_fd *poStack_18;
  int dscp_local;
  os_fd *sock_local;
  
  local_1c = dscp;
  poStack_18 = sock;
  if (ipv6) {
    iVar1 = setsockopt(sock->fd,0x29,0x43,&local_1c,4);
    if (iVar1 < 0) {
      return -1;
    }
  }
  else {
    iVar1 = setsockopt(sock->fd,0,1,&local_1c,4);
    if (iVar1 < 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int
os_fd_generic_set_dscp(struct os_fd *sock, int dscp, bool ipv6) {
  if (ipv6) {
    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_TCLASS, (char *)&dscp, sizeof(dscp)) < 0) {
      return -1;
    }
  }
  else {
    if (setsockopt(sock->fd, IPPROTO_IP, IP_TOS, (char *)&dscp, sizeof(dscp)) < 0) {
      return -1;
    }
  }
  return 0;
}